

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionControlElementType::IfcDistributionControlElementType
          (IfcDistributionControlElementType *this)

{
  IfcDistributionControlElementType *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcDistributionElementType).field_0x1a0,
             "IfcDistributionControlElementType");
  IfcDistributionElementType::IfcDistributionElementType
            (&this->super_IfcDistributionElementType,&PTR_construction_vtable_24__00f0e560);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElementType,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElementType,_0UL> *)
             &(this->super_IfcDistributionElementType).super_IfcElementType.field_0x190,
             &PTR_construction_vtable_24__00f0e698);
  *(undefined8 *)
   &(this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject = 0xf0e430;
  *(undefined8 *)&(this->super_IfcDistributionElementType).field_0x1a0 = 0xf0e548;
  *(undefined8 *)
   &(this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject.field_0x88 = 0xf0e458;
  (this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.
  super_IfcTypeObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0xf0e480;
  *(undefined8 *)
   &(this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject.field_0xf0 = 0xf0e4a8;
  *(undefined8 *)
   &(this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0xf0e4d0;
  *(undefined8 *)&(this->super_IfcDistributionElementType).super_IfcElementType.field_0x180 =
       0xf0e4f8;
  *(undefined8 *)&(this->super_IfcDistributionElementType).super_IfcElementType.field_0x190 =
       0xf0e520;
  return;
}

Assistant:

IfcDistributionControlElementType() : Object("IfcDistributionControlElementType") {}